

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bool.cpp
# Opt level: O1

void bool_rel(BoolView *x,BoolRelType t,BoolView *y,BoolView *z)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  BoolRelType BVar4;
  byte *pbVar5;
  int m;
  uint uVar6;
  BoolRelType BVar7;
  uint uVar8;
  long lVar9;
  BoolRelType BVar10;
  bool bVar11;
  vec<Lit> ps;
  BoolView v [3];
  uint local_90;
  Lit local_7c;
  vec<Lit> local_78;
  undefined **local_68;
  uint local_60;
  byte local_5c [4];
  undefined **local_58;
  int local_50;
  undefined1 local_4c;
  undefined **local_48;
  int local_40;
  undefined1 local_3c;
  
  local_68 = &PTR_finished_0020fb28;
  local_60 = x->v;
  local_5c[0] = x->s;
  local_58 = &PTR_finished_0020fb28;
  local_50 = y->v;
  local_4c = y->s;
  local_48 = &PTR_finished_0020fb28;
  local_40 = z->v;
  local_3c = z->s;
  local_90 = 1;
  BVar7 = 0;
  do {
    uVar8 = 0;
    do {
      uVar2 = 0;
      for (uVar3 = uVar8; uVar3 != 0; uVar3 = uVar3 - 1 & uVar3) {
        uVar2 = uVar2 + 1;
      }
      if (uVar2 == local_90) {
        uVar3 = 0;
        do {
          if ((uVar3 & ~uVar8) == 0) {
            uVar2 = 0;
            BVar10 = 0;
            do {
              uVar6 = 0;
              bVar11 = true;
              do {
                bVar1 = bVar11;
                if (((uVar2 ^ uVar3) >> (uVar6 & 0x1f) & 1) == 0) {
                  bVar1 = false;
                }
                if ((uVar8 >> (uVar6 & 0x1f) & 1) == 0) {
                  bVar1 = bVar11;
                }
                uVar6 = uVar6 + 1;
                bVar11 = bVar1;
              } while (uVar6 != 3);
              BVar4 = 1 << ((byte)uVar2 & 0x1f);
              if (!bVar1) {
                BVar4 = 0;
              }
              BVar10 = BVar10 | BVar4;
              uVar2 = uVar2 + 1;
            } while (uVar2 != 8);
            if (((BVar10 & t) == 0) && ((BVar10 & ~BVar7) != 0)) {
              local_78.sz = 0;
              local_78.cap = 0;
              local_78.data = (Lit *)0x0;
              pbVar5 = local_5c;
              lVar9 = 0;
              do {
                uVar2 = 1 << ((byte)lVar9 & 0x1f);
                if ((uVar8 >> ((uint)lVar9 & 0x1f) & 1) != 0) {
                  if (local_90 == 1) {
                    bVar11 = (uVar3 & uVar2) != 0;
                    if (((uint)(*pbVar5 ^ bVar11) * 2 + -1 !=
                         (int)sat.assigns.data[*(uint *)(pbVar5 + -4)]) &&
                       (SAT::cEnqueue(&sat,(Lit)((uint)((bool)*pbVar5 == bVar11) +
                                                *(uint *)(pbVar5 + -4) * 2),(Reason)0x0),
                       sat.confl != (Clause *)0x0)) {
                      puts("=====UNSATISFIABLE=====");
                      printf("%% Top level failure!\n");
                      exit(0);
                    }
                  }
                  local_7c.x = (uint)((bool)*pbVar5 == ((uVar3 & uVar2) != 0)) +
                               *(int *)(pbVar5 + -4) * 2;
                  vec<Lit>::push(&local_78,&local_7c);
                }
                lVar9 = lVar9 + 1;
                pbVar5 = pbVar5 + 0x10;
              } while (lVar9 != 3);
              if (1 < local_90) {
                SAT::addClause(&sat,&local_78,false);
              }
              if (local_78.data != (Lit *)0x0) {
                free(local_78.data);
              }
              BVar7 = BVar7 | BVar10;
            }
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 != 8);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != 8);
    local_90 = local_90 + 1;
    if (local_90 == 4) {
      return;
    }
  } while( true );
}

Assistant:

void bool_rel(BoolView x, BoolRelType t, BoolView y, BoolView z) {
	//	NOT_SUPPORTED;
	const BoolView v[3] = {std::move(x), std::move(y), std::move(z)};
	int u = 0;

	for (int l = 1; l <= 3; l++) {
		for (int i = 0; i < 8; i++) {
			if (bitcount<int>(i) != l) {
				continue;
			}
			for (int j = 0; j < 8; j++) {
				if ((j & ~i) != 0) {
					continue;
				}
				int flags = 0;
				for (int k = 0; k < 8; k++) {
					bool pass = true;
					for (int m = 0; m < 3; m++) {
						if ((i & (1 << m)) == 0) {
							continue;
						}
						if (((k ^ j) & (1 << m)) == 0) {
							pass = false;
						}
					}
					if (pass) {
						flags |= (1 << k);
					}
				}
				if ((t & flags) != 0) {
					continue;
				}
				if ((flags & ~u) == 0) {
					continue;
				}
				vec<Lit> ps;
				for (int m = 0; m < 3; m++) {
					if ((i & (1 << m)) == 0) {
						continue;
					}
					const bool p = ((j >> m) & 1) != 0;
					if (l == 1) {
						if (v[m].setValNotR(p)) {
							if (!v[m].setVal(p)) {
								TL_FAIL();
							}
						}
					}
					ps.push(v[m].getLit(p));
				}
				if (l >= 2) {
					sat.addClause(ps);
				}
				u |= flags;
			}
		}
	}
}